

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall
wasm::FunctionValidator::visitAtomicNotify(FunctionValidator *this,AtomicNotify *curr)

{
  Name *pNVar1;
  bool result;
  Module *pMVar2;
  Type local_60;
  Type local_58;
  uintptr_t local_50;
  uintptr_t local_48;
  Type local_40;
  Type local_38;
  size_t local_30;
  char *local_28;
  Memory *local_20;
  Memory *memory;
  AtomicNotify *curr_local;
  FunctionValidator *this_local;
  
  memory = (Memory *)curr;
  curr_local = (AtomicNotify *)this;
  pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  pNVar1 = &(memory->super_Importable).base;
  local_30 = (pNVar1->super_IString).str._M_len;
  local_28 = (memory->super_Importable).base.super_IString.str._M_str;
  local_20 = Module::getMemoryOrNull(pMVar2,(Name)(pNVar1->super_IString).str);
  shouldBeTrue<wasm::AtomicNotify*>
            (this,local_20 != (Memory *)0x0,(AtomicNotify *)memory,
             "memory.atomicNotify memory must exist");
  pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  result = FeatureSet::hasAtomics(&pMVar2->features);
  shouldBeTrue<wasm::AtomicNotify*>
            (this,result,(AtomicNotify *)memory,
             "Atomic operations require threads [--enable-threads]");
  local_38.id = (uintptr_t)(memory->super_Importable).super_Named.name.super_IString.str._M_str;
  wasm::Type::Type(&local_40,i32);
  shouldBeEqualOrFirstIsUnreachable<wasm::AtomicNotify*,wasm::Type>
            (this,local_38,local_40,(AtomicNotify *)memory,"AtomicNotify must have type i32");
  local_48 = *(uintptr_t *)((memory->super_Importable).module.super_IString.str._M_len + 8);
  local_50 = (local_20->addressType).id;
  shouldBeEqualOrFirstIsUnreachable<wasm::AtomicNotify*,wasm::Type>
            (this,(Type)local_48,(Type)local_50,(AtomicNotify *)memory,
             "AtomicNotify pointer must match memory index type");
  local_58.id = *(uintptr_t *)((memory->super_Importable).module.super_IString.str._M_str + 8);
  wasm::Type::Type(&local_60,i32);
  shouldBeEqualOrFirstIsUnreachable<wasm::AtomicNotify*,wasm::Type>
            (this,local_58,local_60,(AtomicNotify *)memory,
             "AtomicNotify notifyCount type must be i32");
  return;
}

Assistant:

void FunctionValidator::visitAtomicNotify(AtomicNotify* curr) {
  auto* memory = getModule()->getMemoryOrNull(curr->memory);
  shouldBeTrue(!!memory, curr, "memory.atomicNotify memory must exist");
  shouldBeTrue(getModule()->features.hasAtomics(),
               curr,
               "Atomic operations require threads [--enable-threads]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->type, Type(Type::i32), curr, "AtomicNotify must have type i32");
  shouldBeEqualOrFirstIsUnreachable(
    curr->ptr->type,
    memory->addressType,
    curr,
    "AtomicNotify pointer must match memory index type");
  shouldBeEqualOrFirstIsUnreachable(
    curr->notifyCount->type,
    Type(Type::i32),
    curr,
    "AtomicNotify notifyCount type must be i32");
}